

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O3

utf8_char_t *
caption_frame_read_char(caption_frame_t *frame,int row,int col,eia608_style_t *style,int *underline)

{
  utf8_char_t *puVar1;
  caption_frame_cell_t *pcVar2;
  
  if ((uint)row < 0xf && (uint)col < 0x20) {
    pcVar2 = (frame->front).cell[(uint)row] + (uint)col;
    if (style != (eia608_style_t *)0x0) {
      *style = *(uint *)pcVar2 >> 1 & eia608_style_italics;
    }
    if (underline != (int *)0x0) {
      *underline = *(byte *)pcVar2 & 1;
    }
    puVar1 = (frame->front).cell[(uint)row][(uint)col].data;
  }
  else {
    if (style != (eia608_style_t *)0x0) {
      *style = eia608_style_white;
    }
    puVar1 = "";
    if (underline != (int *)0x0) {
      *underline = 0;
      return puVar1;
    }
  }
  return puVar1;
}

Assistant:

const utf8_char_t* caption_frame_read_char(caption_frame_t* frame, int row, int col, eia608_style_t* style, int* underline)
{
    // always read from front
    caption_frame_cell_t* cell = frame_buffer_cell(&frame->front, row, col);

    if (!cell) {
        if (style) {
            (*style) = eia608_style_white;
        }

        if (underline) {
            (*underline) = 0;
        }

        return EIA608_CHAR_NULL;
    }

    if (style) {
        (*style) = cell->sty;
    }

    if (underline) {
        (*underline) = cell->uln;
    }

    return &cell->data[0];
}